

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O1

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig p_Var1;
  int iVar2;
  GLFWbool GVar3;
  char *__s1;
  XVisualInfo *pXVar4;
  _GLFWfbconfig *p_Var5;
  uint uVar6;
  long lVar7;
  GLXFBConfig *pp_Var8;
  int value;
  int nativeCount;
  uint local_60;
  bool local_59;
  uint local_58;
  int local_54;
  _GLFWfbconfig *local_50;
  GLXFBConfig *local_48;
  GLXFBConfig *local_40;
  _GLFWfbconfig *local_38;
  
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if (__s1 == (char *)0x0) {
    local_59 = true;
  }
  else {
    iVar2 = strcmp(__s1,"Chromium");
    local_59 = iVar2 != 0;
  }
  local_48 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_54);
  if (local_48 == (GLXFBConfig *)0x0 || local_54 == 0) {
    uVar6 = 0;
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
  }
  else {
    local_40 = result;
    local_50 = (_GLFWfbconfig *)_glfw_calloc((long)local_54,0x48);
    pp_Var8 = local_48;
    if (local_54 < 1) {
      local_58 = 0;
    }
    else {
      lVar7 = 0;
      local_58 = 0;
      local_38 = desired;
      do {
        p_Var1 = pp_Var8[lVar7];
        (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8011,(int *)&local_60);
        if ((((local_60 & 1) != 0) &&
            ((*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8010,(int *)&local_60),
            (local_59 & (local_60 & 1) == 0) == 0)) &&
           ((*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,5,(int *)&local_60),
           local_60 == desired->doublebuffer)) {
          p_Var5 = local_50 + (int)local_58;
          if ((desired->transparent != 0) &&
             (pXVar4 = (*_glfw.glx.GetVisualFromFBConfig)(_glfw.x11.display,p_Var1),
             pXVar4 != (XVisualInfo *)0x0)) {
            GVar3 = _glfwIsVisualTransparentX11(pXVar4->visual);
            p_Var5->transparent = GVar3;
            (*_glfw.x11.xlib.Free)(pXVar4);
          }
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,8,(int *)&local_60);
          p_Var5->redBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,9,(int *)&local_60);
          p_Var5->greenBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,10,(int *)&local_60);
          p_Var5->blueBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xb,(int *)&local_60);
          p_Var5->alphaBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xc,(int *)&local_60);
          p_Var5->depthBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xd,(int *)&local_60);
          p_Var5->stencilBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xe,(int *)&local_60);
          p_Var5->accumRedBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xf,(int *)&local_60);
          p_Var5->accumGreenBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x10,(int *)&local_60);
          p_Var5->accumBlueBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x11,(int *)&local_60);
          p_Var5->accumAlphaBits = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,7,(int *)&local_60);
          p_Var5->auxBuffers = local_60;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,6,(int *)&local_60);
          if (local_60 != 0) {
            p_Var5->stereo = 1;
          }
          if (_glfw.glx.ARB_multisample != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x186a1,(int *)&local_60);
            p_Var5->samples = local_60;
          }
          if (_glfw.glx.EXT_framebuffer_sRGB != 0 || _glfw.glx.ARB_framebuffer_sRGB != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x20b2,(int *)&local_60);
            p_Var5->sRGB = local_60;
          }
          p_Var5->handle = (uintptr_t)p_Var1;
          local_58 = local_58 + 1;
          desired = local_38;
          pp_Var8 = local_48;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_54);
    }
    p_Var5 = _glfwChooseFBConfig(desired,local_50,local_58);
    if (p_Var5 != (_GLFWfbconfig *)0x0) {
      *local_40 = (GLXFBConfig)p_Var5->handle;
    }
    uVar6 = (uint)(p_Var5 != (_GLFWfbconfig *)0x0);
    (*_glfw.x11.xlib.Free)(pp_Var8);
    _glfw_free(local_50);
  }
  return uVar6;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired,
                                  GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeConfigs || !nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = _glfw_calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (int i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER) != desired->doublebuffer)
            continue;

        if (desired->transparent)
        {
            XVisualInfo* vi = glXGetVisualFromFBConfig(_glfw.x11.display, n);
            if (vi)
            {
                u->transparent = _glfwIsVisualTransparentX11(vi->visual);
                XFree(vi);
            }
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    _glfw_free(usableConfigs);

    return closest != NULL;
}